

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::processQueryCommand(CoreBroker *this,ActionMessage *cmd)

{
  action_t aVar1;
  int iVar2;
  GlobalFederateId fedid;
  _func_int *UNRECOVERED_JUMPTABLE;
  route_id rVar3;
  string *__str;
  mapped_type *this_00;
  allocator<char> local_49;
  key_type local_48;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  aVar1 = cmd->messageAction;
  if (aVar1 == cmd_set_global) {
    if ((this->super_BrokerBase).field_0x294 == '\x01') {
      __str = ActionMessage::getString_abi_cxx11_(cmd,0);
      local_28._M_len = (cmd->payload).bufferSize;
      local_28._M_str = (char *)(cmd->payload).heap;
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_48,&local_28,&local_49);
      this_00 = CLI::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->global_values,&local_48);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__str)
      ;
      std::__cxx11::string::~string((string *)&local_48);
      return;
    }
    iVar2 = (this->super_BrokerBase).global_broker_id_local.gid;
    if (((iVar2 != -2010000000) && (iVar2 != -1700000000)) && (iVar2 != 0)) {
      (*(this->super_Broker)._vptr_Broker[0x22])(this,0,cmd);
      return;
    }
    gmlc::containers::SimpleQueue<helics::ActionMessage,std::mutex>::push<helics::ActionMessage&>
              ((SimpleQueue<helics::ActionMessage,std::mutex> *)&this->delayTransmitQueue,cmd);
    return;
  }
  if (aVar1 == cmd_query_reply) {
LAB_002cab45:
    fedid.gid = (cmd->dest_id).gid;
    if (fedid.gid != (this->super_BrokerBase).global_broker_id_local.gid) {
      rVar3 = getRoute(this,fedid);
      UNRECOVERED_JUMPTABLE = (this->super_Broker)._vptr_Broker[0x22];
      (*UNRECOVERED_JUMPTABLE)(this,(ulong)(uint)rVar3.rid,cmd,UNRECOVERED_JUMPTABLE);
      return;
    }
    processQueryResponse(this,cmd);
    return;
  }
  if (aVar1 == cmd_query) {
LAB_002cab66:
    processQuery(this,cmd);
    return;
  }
  if (aVar1 != cmd_broker_query) {
    if (aVar1 == cmd_query_ordered) goto LAB_002cab66;
    if (aVar1 == cmd_query_reply_ordered) goto LAB_002cab45;
    if (aVar1 != cmd_broker_query_ordered) {
      return;
    }
  }
  if ((this->super_BrokerBase).field_0x295 == '\0') {
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
    emplace_back<helics::ActionMessage>(&this->earlyMessages,cmd);
    return;
  }
  iVar2 = (cmd->dest_id).gid;
  if ((iVar2 != (this->super_BrokerBase).global_broker_id_local.gid) &&
     ((iVar2 != 0 || ((this->super_BrokerBase).field_0x294 == '\0')))) {
    routeMessage(this,cmd);
    return;
  }
  processLocalQuery(this,cmd);
  return;
}

Assistant:

void CoreBroker::processQueryCommand(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_BROKER_QUERY:
        case CMD_BROKER_QUERY_ORDERED:
            if (!connectionEstablished) {
                earlyMessages.push_back(std::move(cmd));
                break;
            }
            if (cmd.dest_id == global_broker_id_local ||
                (isRootc && cmd.dest_id == parent_broker_id)) {
                processLocalQuery(cmd);
            } else {
                routeMessage(cmd);
            }
            break;
        case CMD_QUERY:
        case CMD_QUERY_ORDERED:
            processQuery(cmd);
            break;
        case CMD_QUERY_REPLY:
        case CMD_QUERY_REPLY_ORDERED:
            if (cmd.dest_id == global_broker_id_local) {
                processQueryResponse(cmd);
            } else {
                transmit(getRoute(cmd.dest_id), cmd);
            }
            break;
        case CMD_SET_GLOBAL:
            if (isRootc) {
                global_values[std::string(cmd.payload.to_string())] = cmd.getString(0);
            } else {
                if ((global_broker_id_local.isValid()) &&
                    (global_broker_id_local != parent_broker_id)) {
                    transmit(parent_route_id, cmd);
                } else {
                    // delay the response if we are not fully registered yet
                    delayTransmitQueue.push(cmd);
                }
            }
            break;
        default:
            break;
    }
}